

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlunicode.c
# Opt level: O3

int xmlUCSIsCatPc(int code)

{
  if ((((0x15 < code - 0x203fU) || ((0x200003U >> (code - 0x203fU & 0x1f) & 1) == 0)) &&
      (code != 0x5f)) &&
     (((code != 0x30fb && (1 < code - 0xfe33U)) && ((2 < code - 0xfe4dU && (code != 0xff3f)))))) {
    return (int)(code == 0xff65);
  }
  return 1;
}

Assistant:

int
xmlUCSIsCatPc(int code) {
    return((code == 0x5f) ||
           ((code >= 0x203f) && (code <= 0x2040)) ||
           (code == 0x2054) ||
           (code == 0x30fb) ||
           ((code >= 0xfe33) && (code <= 0xfe34)) ||
           ((code >= 0xfe4d) && (code <= 0xfe4f)) ||
           (code == 0xff3f) ||
           (code == 0xff65));
}